

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O2

EStatusCode __thiscall
ObjectsContext::WriteXrefStream(ObjectsContext *this,DictionaryContext *inDictionaryContext)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  ObjectIDType OVar2;
  ObjectWriteInformation *pOVar3;
  IByteWriter *pIVar4;
  ObjectWriteInformation *pOVar5;
  Trace *this_01;
  unsigned_long inElement;
  ObjectIDType i;
  long inIntegerToken;
  ulong uVar6;
  PDFStream *pPVar7;
  PDFStream *pPVar8;
  int iVar9;
  IndirectObjectsReferenceRegistry *this_02;
  ulong uVar10;
  allocator<char> local_69;
  PDFStream *local_68;
  ObjectsContext *local_60;
  ObjectWriteInformation *local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Index",&local_69);
  DictionaryContext::WriteKey(inDictionaryContext,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::StartArray(this_00);
  this_02 = &this->mReferencesRegistry;
  uVar10 = 0;
  local_60 = this;
  while (OVar2 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_02), uVar10 < OVar2) {
    inIntegerToken = 0;
    while( true ) {
      uVar6 = uVar10 + inIntegerToken;
      OVar2 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_02);
      if ((OVar2 <= uVar6) ||
         (pOVar3 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_02,uVar6),
         pOVar3->mIsDirty != true)) break;
      inIntegerToken = inIntegerToken + 1;
    }
    PrimitiveObjectsWriter::WriteInteger(this_00,uVar10,eTokenSeparatorSpace);
    PrimitiveObjectsWriter::WriteInteger(this_00,inIntegerToken,eTokenSeparatorSpace);
    uVar10 = uVar6;
    while ((OVar2 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_02), uVar10 < OVar2 &&
           (pOVar3 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_02,uVar10),
           pOVar3->mIsDirty == false))) {
      uVar10 = uVar10 + 1;
    }
  }
  PrimitiveObjectsWriter::EndArray(this_00,eTokenSeparatorNone);
  PrimitiveObjectsWriter::EndLine(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"W",&local_69);
  DictionaryContext::WriteKey(inDictionaryContext,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  PrimitiveObjectsWriter::StartArray(this_00);
  PrimitiveObjectsWriter::WriteInteger(this_00,1,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteInteger(this_00,8,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteInteger(this_00,8,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::EndArray(this_00,eTokenSeparatorNone);
  PrimitiveObjectsWriter::EndLine(this_00);
  local_68 = StartPDFStream(local_60,inDictionaryContext,true);
  iVar9 = 0;
  uVar10 = 0;
  uVar6 = 0;
  do {
    OVar2 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_02);
    if ((iVar9 != 0) || (OVar2 <= uVar6)) {
      if (iVar9 == 0) {
        EVar1 = EndPDFStream(local_60,local_68);
      }
      else {
        EVar1 = eFailure;
      }
      return EVar1;
    }
    pOVar3 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_02,uVar6);
    iVar9 = 0;
    if (pOVar3->mIsDirty == true) {
      pOVar3 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_02,uVar6);
      pPVar8 = local_68;
      if (pOVar3->mObjectReferenceType == Used) {
        if (pOVar3->mObjectWritten != true) {
          this_01 = Trace::DefaultTrace();
          Trace::TraceToLog(this_01,
                            "ObjectsContext::WriteXrefStream, Unexpected Failure. Object of ID = %ld was not registered as written. probably means it was not written"
                            ,uVar6);
          iVar9 = -1;
          goto LAB_00191540;
        }
        pPVar7 = local_68;
        pIVar4 = PDFStream::GetWriteStream(local_68);
        WriteXrefNumber((ObjectsContext *)pPVar7,pIVar4,1,1);
        pIVar4 = PDFStream::GetWriteStream(pPVar8);
        WriteXrefNumber((ObjectsContext *)pPVar8,pIVar4,pOVar3->mWritePosition,8);
        pPVar8 = local_68;
        pIVar4 = PDFStream::GetWriteStream(local_68);
        inElement = pOVar3->mGenerationNumber;
      }
      else {
        do {
          uVar10 = uVar10 + 1;
          OVar2 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_02);
          if (OVar2 <= uVar10) break;
          pOVar5 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_02,uVar10);
        } while ((pOVar5->mIsDirty == false) ||
                (pOVar5 = IndirectObjectsReferenceRegistry::GetNthObjectReference(this_02,uVar10),
                pOVar5->mObjectReferenceType != Free));
        OVar2 = IndirectObjectsReferenceRegistry::GetObjectsCount(this_02);
        pPVar8 = local_68;
        if (OVar2 == uVar10) {
          uVar10 = 0;
        }
        pPVar7 = local_68;
        local_58 = pOVar3;
        pIVar4 = PDFStream::GetWriteStream(local_68);
        WriteXrefNumber((ObjectsContext *)pPVar7,pIVar4,0,1);
        pPVar7 = pPVar8;
        pIVar4 = PDFStream::GetWriteStream(pPVar8);
        WriteXrefNumber((ObjectsContext *)pPVar7,pIVar4,uVar10,8);
        pIVar4 = PDFStream::GetWriteStream(pPVar8);
        inElement = local_58->mGenerationNumber;
      }
      iVar9 = 0;
      WriteXrefNumber((ObjectsContext *)pPVar8,pIVar4,inElement,8);
    }
LAB_00191540:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

EStatusCode ObjectsContext::WriteXrefStream(DictionaryContext* inDictionaryContext)
{
    // k. complement input dictionary with the relevant entries - W and Index
    // then continue with a regular stream, forced to have "length" as direct object
    
    // write Index entry
    inDictionaryContext->WriteKey("Index");
    StartArray();
    
    ObjectIDType startID = 0;
    ObjectIDType firstIDNotInRange;
 
    while(startID < mReferencesRegistry.GetObjectsCount())
    {
        firstIDNotInRange = startID;
        
        // look for first ID that does not require update [for first version of PDF...it will be the end]
        while(firstIDNotInRange < mReferencesRegistry.GetObjectsCount() &&
              mReferencesRegistry.GetNthObjectReference(firstIDNotInRange).mIsDirty)
            ++firstIDNotInRange;
        
        // write section header
        mPrimitiveWriter.WriteInteger(startID);
        mPrimitiveWriter.WriteInteger(firstIDNotInRange - startID);
        
        startID = firstIDNotInRange;
        
        // now promote startID to the next object to update
        while(startID < mReferencesRegistry.GetObjectsCount() &&
              !mReferencesRegistry.GetNthObjectReference(startID).mIsDirty)
            ++startID;        
    }
    
    EndArray();
    EndLine();
    
    // write W entry, which is going to be 1 sizeof(long long) and sizeof(unsigned long), per the types i'm using
    
    size_t typeSize = 1;
    size_t locationSize = sizeof(LongFilePositionType);
    size_t generationSize = sizeof(unsigned long);
    
    inDictionaryContext->WriteKey("W");
    StartArray();
    WriteInteger(typeSize);
    WriteInteger(locationSize);
    WriteInteger(generationSize);
    EndArray();
    EndLine();
    
    // start the xref stream itself
    PDFStream* aStream = StartPDFStream(inDictionaryContext,true);
    
    // now write the table data itself
    EStatusCode status = eSuccess;
    ObjectIDType nextFreeObject = 0;
    
    do {
    
        for(ObjectIDType i = 0; i < mReferencesRegistry.GetObjectsCount() && eSuccess == status;++i)
        {
            if(!mReferencesRegistry.GetNthObjectReference(i).mIsDirty)
                continue;
     
            const ObjectWriteInformation& objectReference = mReferencesRegistry.GetNthObjectReference(i);

            if(objectReference.mObjectReferenceType == ObjectWriteInformation::Used)
            {
                // used object
                
                if(objectReference.mObjectWritten)
                {
                    WriteXrefNumber(aStream->GetWriteStream(),1,typeSize);
                    WriteXrefNumber(aStream->GetWriteStream(),objectReference.mWritePosition,locationSize);
                    WriteXrefNumber(aStream->GetWriteStream(),objectReference.mGenerationNumber,generationSize);
                }
                else
                {
                    // object not written. at this point this should not happen, and indicates a failure
                    status = PDFHummus::eFailure;
                    TRACE_LOG1("ObjectsContext::WriteXrefStream, Unexpected Failure. Object of ID = %ld was not registered as written. probably means it was not written",i);
                }
            }
            else 
            {
                // free object
                
                ++nextFreeObject;
                // look for next dirty & free object, to be the next item of linked list
                while(nextFreeObject < mReferencesRegistry.GetObjectsCount() &&
                      (!mReferencesRegistry.GetNthObjectReference(nextFreeObject).mIsDirty ||
                       mReferencesRegistry.GetNthObjectReference(nextFreeObject).mObjectReferenceType != ObjectWriteInformation::Free))
                    ++nextFreeObject;
                
                // if reached end of list, then link back to head - 0
                if(nextFreeObject == mReferencesRegistry.GetObjectsCount())
                    nextFreeObject = 0;
     
                WriteXrefNumber(aStream->GetWriteStream(),0,typeSize);
                WriteXrefNumber(aStream->GetWriteStream(),nextFreeObject,locationSize);
                WriteXrefNumber(aStream->GetWriteStream(),objectReference.mGenerationNumber,generationSize);
                
            }

        }
        
        if(status != eSuccess)
            break;
            
        // end the stream and g'bye
        status = EndPDFStream(aStream);

    } 
    while (false);

    return status;
}